

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void update_val_from_objs(Am_Object *cmd,Am_Value *objs_value,Am_Value_List *new_list)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object obj;
  Am_Value old_value;
  undefined1 local_50 [8];
  Am_Value_List obj_list;
  Am_Value_List value_list;
  Am_Get_Object_Property_Value_Method get_obj_val_method;
  Am_Value_List *new_list_local;
  Am_Value *objs_value_local;
  Am_Object *cmd_local;
  
  Am_Get_Object_Property_Value_Method::Am_Get_Object_Property_Value_Method
            ((Am_Get_Object_Property_Value_Method *)&value_list.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)&obj_list.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_50);
  Am_Value::Am_Value((Am_Value *)&obj);
  Am_Object::Am_Object(&local_78);
  pAVar2 = Am_Object::Get(cmd,0x199,0);
  Am_Get_Object_Property_Value_Method::operator=
            ((Am_Get_Object_Property_Value_Method *)&value_list.item,pAVar2);
  Am_Value_List::operator=((Am_Value_List *)local_50,objs_value);
  Am_Value_List::Start((Am_Value_List *)&obj_list.item);
  Am_Value_List::Start((Am_Value_List *)local_50);
  while( true ) {
    bVar1 = Am_Value_List::Last((Am_Value_List *)local_50);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pAVar2 = Am_Value_List::Get((Am_Value_List *)local_50);
    Am_Object::operator=(&local_78,pAVar2);
    Am_Object::Am_Object(&local_80,cmd);
    Am_Object::Am_Object(&local_88,&local_78);
    (*(code *)get_obj_val_method.from_wrapper)(&local_80,&local_88,&obj);
    Am_Object::~Am_Object(&local_88);
    Am_Object::~Am_Object(&local_80);
    Am_Value_List::Add((Am_Value_List *)&obj_list.item,(Am_Value *)&obj,Am_TAIL,true);
    Am_Value_List::Next((Am_Value_List *)local_50);
  }
  Am_Value_List::operator=(new_list,(Am_Value_List *)&obj_list.item);
  Am_Object::~Am_Object(&local_78);
  Am_Value::~Am_Value((Am_Value *)&obj);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_50);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&obj_list.item);
  return;
}

Assistant:

void
update_val_from_objs(Am_Object cmd, Am_Value objs_value,
                     Am_Value_List &new_list)
{
  Am_Get_Object_Property_Value_Method get_obj_val_method;
  Am_Value_List value_list, obj_list;
  Am_Value old_value;
  Am_Object obj;
  get_obj_val_method = cmd.Get(Am_GET_OBJECT_VALUE_METHOD);
  obj_list = objs_value;
  value_list.Start();
  for (obj_list.Start(); !obj_list.Last(); obj_list.Next()) {
    obj = obj_list.Get();
    get_obj_val_method.Call(cmd, obj, old_value);
    value_list.Add(old_value);
  }
  //std::cout << "update val for " << objs_value << " to " << value_list
  // <<std::endl <<std::flush;
  new_list = value_list;
}